

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void write_buffer_4x4(__m128i *in,uint16_t *output,int stride,int fliplr,int flipud,int shift,int bd
                     )

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  longlong lVar4;
  longlong lVar5;
  int bd_00;
  ulong uVar6;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar11 [16];
  __m128i u;
  __m128i alVar12;
  
  uVar6 = (ulong)(uint)shift;
  round_shift_4x4(in,shift);
  auVar7 = pmovzxwd(extraout_XMM0,*(undefined8 *)output);
  auVar9 = pmovzxwd(in_XMM1,*(undefined8 *)(output + stride));
  uVar2 = *(ulong *)(output + stride * 3);
  auVar11 = pmovzxwd(in_XMM3,*(undefined8 *)(output + stride * 2));
  if (fliplr != 0) {
    lVar4 = (*in)[0];
    puVar3 = (undefined4 *)((long)*in + 4);
    uVar1 = *puVar3;
    lVar5 = (*in)[1];
    *(undefined4 *)*in = *puVar3;
    *(int *)((long)*in + 4) = (int)lVar5;
    *(undefined4 *)(*in + 1) = uVar1;
    *(int *)((long)*in + 0xc) = (int)lVar4;
    lVar4 = in[1][0];
    puVar3 = (undefined4 *)((long)in[1] + 4);
    uVar1 = *puVar3;
    lVar5 = in[1][1];
    *(undefined4 *)in[1] = *puVar3;
    *(int *)((long)in[1] + 4) = (int)lVar5;
    *(undefined4 *)(in[1] + 1) = uVar1;
    *(int *)((long)in[1] + 0xc) = (int)lVar4;
    lVar4 = in[2][0];
    puVar3 = (undefined4 *)((long)in[2] + 4);
    uVar1 = *puVar3;
    lVar5 = in[2][1];
    *(undefined4 *)in[2] = *puVar3;
    *(int *)((long)in[2] + 4) = (int)lVar5;
    *(undefined4 *)(in[2] + 1) = uVar1;
    *(int *)((long)in[2] + 0xc) = (int)lVar4;
    lVar4 = in[3][0];
    puVar3 = (undefined4 *)((long)in[3] + 4);
    uVar1 = *puVar3;
    lVar5 = in[3][1];
    *(undefined4 *)in[3] = *puVar3;
    *(int *)((long)in[3] + 4) = (int)lVar5;
    *(undefined4 *)(in[3] + 1) = uVar1;
    *(int *)((long)in[3] + 0xc) = (int)lVar4;
  }
  if (flipud == 0) {
    auVar8._0_4_ = auVar7._0_4_ + (int)(*in)[0];
    auVar8._4_4_ = auVar7._4_4_ + *(int *)((long)*in + 4);
    auVar8._8_4_ = auVar7._8_4_ + (int)(*in)[1];
    auVar8._12_4_ = auVar7._12_4_ + *(int *)((long)*in + 0xc);
    auVar7._0_4_ = auVar9._0_4_ + (int)in[1][0];
    auVar7._4_4_ = auVar9._4_4_ + *(int *)((long)in[1] + 4);
    auVar7._8_4_ = auVar9._8_4_ + (int)in[1][1];
    auVar7._12_4_ = auVar9._12_4_ + *(int *)((long)in[1] + 0xc);
    auVar9._0_4_ = auVar11._0_4_ + (int)in[2][0];
    auVar9._4_4_ = auVar11._4_4_ + *(int *)((long)in[2] + 4);
    auVar9._8_4_ = auVar11._8_4_ + (int)in[2][1];
    auVar9._12_4_ = auVar11._12_4_ + *(int *)((long)in[2] + 0xc);
    in = in + 3;
  }
  else {
    auVar8._0_4_ = auVar7._0_4_ + (int)in[3][0];
    auVar8._4_4_ = auVar7._4_4_ + *(int *)((long)in[3] + 4);
    auVar8._8_4_ = auVar7._8_4_ + (int)in[3][1];
    auVar8._12_4_ = auVar7._12_4_ + *(int *)((long)in[3] + 0xc);
    auVar7._0_4_ = auVar9._0_4_ + (int)in[2][0];
    auVar7._4_4_ = auVar9._4_4_ + *(int *)((long)in[2] + 4);
    auVar7._8_4_ = auVar9._8_4_ + (int)in[2][1];
    auVar7._12_4_ = auVar9._12_4_ + *(int *)((long)in[2] + 0xc);
    auVar9._0_4_ = auVar11._0_4_ + (int)in[1][0];
    auVar9._4_4_ = auVar11._4_4_ + *(int *)((long)in[1] + 4);
    auVar9._8_4_ = auVar11._8_4_ + (int)in[1][1];
    auVar9._12_4_ = auVar11._12_4_ + *(int *)((long)in[1] + 0xc);
  }
  packusdw(auVar8,auVar7);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar7 = pmovzxwd(auVar11,auVar11);
  auVar10._0_4_ = auVar7._0_4_ + (int)(*in)[0];
  auVar10._4_4_ = auVar7._4_4_ + *(int *)((long)*in + 4);
  auVar10._8_4_ = auVar7._8_4_ + (int)(*in)[1];
  auVar10._12_4_ = auVar7._12_4_ + *(int *)((long)*in + 0xc);
  packusdw(auVar9,auVar10);
  alVar12[0] = (ulong)(uint)bd;
  alVar12[1] = uVar6;
  alVar12 = highbd_clamp_epi16(alVar12,bd_00);
  u[0] = (ulong)(uint)bd;
  u[1] = uVar6;
  highbd_clamp_epi16(u,(int)alVar12[1]);
  *(undefined8 *)output = extraout_XMM0_Qa;
  *(undefined8 *)(output + stride) = extraout_XMM0_Qb;
  *(undefined8 *)(output + stride * 2) = extraout_XMM0_Qa_00;
  *(undefined8 *)(output + stride * 3) = extraout_XMM0_Qb_00;
  return;
}

Assistant:

static void write_buffer_4x4(__m128i *in, uint16_t *output, int stride,
                             int fliplr, int flipud, int shift, int bd) {
  const __m128i zero = _mm_setzero_si128();
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;

  round_shift_4x4(in, shift);

  v0 = _mm_loadl_epi64((__m128i const *)(output + 0 * stride));
  v1 = _mm_loadl_epi64((__m128i const *)(output + 1 * stride));
  v2 = _mm_loadl_epi64((__m128i const *)(output + 2 * stride));
  v3 = _mm_loadl_epi64((__m128i const *)(output + 3 * stride));

  v0 = _mm_unpacklo_epi16(v0, zero);
  v1 = _mm_unpacklo_epi16(v1, zero);
  v2 = _mm_unpacklo_epi16(v2, zero);
  v3 = _mm_unpacklo_epi16(v3, zero);

  if (fliplr) {
    in[0] = _mm_shuffle_epi32(in[0], 0x1B);
    in[1] = _mm_shuffle_epi32(in[1], 0x1B);
    in[2] = _mm_shuffle_epi32(in[2], 0x1B);
    in[3] = _mm_shuffle_epi32(in[3], 0x1B);
  }

  if (flipud) {
    u0 = _mm_add_epi32(in[3], v0);
    u1 = _mm_add_epi32(in[2], v1);
    u2 = _mm_add_epi32(in[1], v2);
    u3 = _mm_add_epi32(in[0], v3);
  } else {
    u0 = _mm_add_epi32(in[0], v0);
    u1 = _mm_add_epi32(in[1], v1);
    u2 = _mm_add_epi32(in[2], v2);
    u3 = _mm_add_epi32(in[3], v3);
  }

  v0 = _mm_packus_epi32(u0, u1);
  v2 = _mm_packus_epi32(u2, u3);

  u0 = highbd_clamp_epi16(v0, bd);
  u2 = highbd_clamp_epi16(v2, bd);

  v0 = _mm_unpacklo_epi64(u0, u0);
  v1 = _mm_unpackhi_epi64(u0, u0);
  v2 = _mm_unpacklo_epi64(u2, u2);
  v3 = _mm_unpackhi_epi64(u2, u2);

  _mm_storel_epi64((__m128i *)(output + 0 * stride), v0);
  _mm_storel_epi64((__m128i *)(output + 1 * stride), v1);
  _mm_storel_epi64((__m128i *)(output + 2 * stride), v2);
  _mm_storel_epi64((__m128i *)(output + 3 * stride), v3);
}